

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDsd.c
# Opt level: O3

Abc_Ntk_t * Abc_NtkDsdInternal(Abc_Ntk_t *pNtk,int fVerbose,int fPrint,int fShort)

{
  int iVar1;
  long *plVar2;
  int *piVar3;
  DdManager *dd;
  DdNode **pbFuncs;
  undefined8 *puVar4;
  uint uVar5;
  uint *__ptr;
  void *pvVar6;
  undefined8 uVar7;
  Dsd_Manager_t *pDsdMan;
  Abc_Ntk_t *pNtk_00;
  anon_union_8_4_617c9805_for_Abc_Obj_t__17 aVar8;
  Abc_Obj_t *pAVar9;
  Dsd_Node_t *pDVar10;
  Dsd_Node_t **__ptr_00;
  Vec_Ptr_t *pVVar11;
  char **pInputNames;
  char **pOutputNames;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  char *__assertion;
  long lVar16;
  int iVar17;
  int local_44;
  long local_40;
  ulong local_38;
  
  pVVar11 = pNtk->vCos;
  uVar5 = pVVar11->nSize;
  __ptr = (uint *)malloc(0x10);
  uVar13 = 8;
  if (6 < uVar5 - 1) {
    uVar13 = (ulong)uVar5;
  }
  __ptr[1] = 0;
  if ((int)uVar13 == 0) {
    pvVar6 = (void *)0x0;
  }
  else {
    pvVar6 = malloc((long)(int)uVar13 << 3);
  }
  *(void **)(__ptr + 2) = pvVar6;
  if (0 < (int)uVar5) {
    lVar15 = 0;
    do {
      plVar2 = (long *)pVVar11->pArray[lVar15];
      if (*(int *)(*(long *)(*plVar2 + 0x1b0) + 4) < 8) goto LAB_002b9276;
      piVar3 = *(int **)(*(long *)(*(long *)(*plVar2 + 0x1b0) + 8) + 0x38);
      pvVar6 = *(void **)(piVar3 + 2);
      if (pvVar6 == (void *)0x0) {
        __assert_fail("p->pArrayPtr",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecAtt.h"
                      ,0xf9,"void *Vec_AttEntry(Vec_Att_t *, int)");
      }
      iVar12 = (int)plVar2[2];
      lVar16 = (long)iVar12;
      iVar1 = *piVar3;
      if (iVar1 <= iVar12) {
        iVar17 = iVar12 + 10;
        if (iVar12 < iVar1 * 2) {
          iVar17 = iVar1 * 2;
        }
        if (iVar1 < iVar17) {
          local_40 = (long)iVar17;
          local_38 = uVar13;
          pvVar6 = realloc(pvVar6,local_40 * 8);
          *(void **)(piVar3 + 2) = pvVar6;
          memset((void *)((long)pvVar6 + (long)*piVar3 * 8),0,(local_40 - *piVar3) * 8);
          *piVar3 = iVar17;
          uVar13 = local_38;
        }
      }
      uVar14 = *(ulong *)((long)pvVar6 + lVar16 * 8);
      if (uVar14 == 0) {
        if (*(code **)(piVar3 + 8) == (code *)0x0) {
          uVar14 = 0;
        }
        else {
          uVar7 = (**(code **)(piVar3 + 8))(*(undefined8 *)(piVar3 + 4));
          *(undefined8 *)(*(long *)(piVar3 + 2) + lVar16 * 8) = uVar7;
          uVar14 = *(ulong *)(*(long *)(piVar3 + 2) + lVar16 * 8);
        }
      }
      uVar5 = *(uint *)((long)plVar2 + 0x14);
      iVar12 = (int)uVar13;
      if ((int)lVar15 == iVar12) {
        if (iVar12 < 0x10) {
          if (*(void **)(__ptr + 2) == (void *)0x0) {
            pvVar6 = malloc(0x80);
          }
          else {
            pvVar6 = realloc(*(void **)(__ptr + 2),0x80);
          }
          *(void **)(__ptr + 2) = pvVar6;
          *__ptr = 0x10;
          uVar13 = 0x10;
        }
        else {
          uVar13 = (ulong)(uint)(iVar12 * 2);
          if (*(void **)(__ptr + 2) == (void *)0x0) {
            pvVar6 = malloc(uVar13 * 8);
          }
          else {
            pvVar6 = realloc(*(void **)(__ptr + 2),uVar13 * 8);
          }
          *(void **)(__ptr + 2) = pvVar6;
          *__ptr = iVar12 * 2;
        }
      }
      else {
        pvVar6 = *(void **)(__ptr + 2);
      }
      *(ulong *)((long)pvVar6 + lVar15 * 8) = uVar5 >> 10 & 1 ^ uVar14;
      lVar15 = lVar15 + 1;
      pVVar11 = pNtk->vCos;
    } while (lVar15 < pVVar11->nSize);
  }
  if (pNtk->vAttrs->nSize < 8) {
LAB_002b9276:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  dd = *(DdManager **)((long)pNtk->vAttrs->pArray[7] + 0x10);
  pDsdMan = Dsd_ManagerStart(dd,pNtk->vCis->nSize,fVerbose);
  pbFuncs = *(DdNode ***)(__ptr + 2);
  if (pDsdMan == (Dsd_Manager_t *)0x0) {
    if (pbFuncs != (DdNode **)0x0) {
      free(pbFuncs);
    }
    free(__ptr);
    Cudd_Quit(dd);
    return (Abc_Ntk_t *)0x0;
  }
  Dsd_Decompose(pDsdMan,pbFuncs,pNtk->vCos->nSize);
  if (pbFuncs != (DdNode **)0x0) {
    free(pbFuncs);
  }
  free(__ptr);
  Abc_NtkFreeGlobalBdds(pNtk,0);
  pNtk_00 = Abc_NtkStartFrom(pNtk,ABC_NTK_LOGIC,ABC_FUNC_BDD);
  Cudd_bddIthVar((DdManager *)pNtk_00->pManFunc,dd->size + -1);
  aVar8.pCopy = Abc_NtkCreateNodeConst1(pNtk_00);
  pAVar9 = Abc_AigConst1(pNtk);
  pAVar9->field_6 = aVar8;
  pDVar10 = Dsd_ManagerReadConst1(pDsdMan);
  Dsd_NodeSetMark(pDVar10,aVar8.iTemp);
  pVVar11 = pNtk->vCis;
  if (0 < pVVar11->nSize) {
    lVar15 = 0;
    do {
      pvVar6 = pVVar11->pArray[lVar15];
      pDVar10 = Dsd_ManagerReadInput(pDsdMan,(int)lVar15);
      Dsd_NodeSetMark(pDVar10,*(int *)((long)pvVar6 + 0x40));
      lVar15 = lVar15 + 1;
      pVVar11 = pNtk->vCis;
    } while (lVar15 < pVVar11->nSize);
  }
  __ptr_00 = Dsd_TreeCollectNodesDfs(pDsdMan,&local_44);
  if (local_44 < 1) {
    if (__ptr_00 == (Dsd_Node_t **)0x0) goto LAB_002b9137;
  }
  else {
    lVar15 = 0;
    do {
      Abc_NtkDsdConstructNode(pDsdMan,__ptr_00[lVar15],pNtk_00,(int *)0x0);
      lVar15 = lVar15 + 1;
    } while (lVar15 < local_44);
  }
  free(__ptr_00);
LAB_002b9137:
  pVVar11 = pNtk->vCos;
  if (0 < pVVar11->nSize) {
    lVar15 = 0;
    do {
      puVar4 = *(undefined8 **)
                (*(long *)(*(long *)(*pVVar11->pArray[lVar15] + 0x20) + 8) +
                (long)**(int **)((long)pVVar11->pArray[lVar15] + 0x20) * 8);
      if ((*(uint *)((long)puVar4 + 0x14) & 0xf) == 7) {
        if (((ulong)puVar4 & 1) != 0) {
          __assertion = "!Abc_ObjIsComplement(pNode)";
LAB_002b92c4:
          __assert_fail(__assertion,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                        ,399,"int Abc_AigNodeIsAnd(Abc_Obj_t *)");
        }
        if (*(int *)*puVar4 != 3) {
          __assertion = "Abc_NtkIsStrash(pNode->pNtk)";
          goto LAB_002b92c4;
        }
        if (*(int *)((long)puVar4 + 0x1c) == 2) {
          pDVar10 = Dsd_ManagerReadRoot(pDsdMan,(int)lVar15);
          uVar5 = Dsd_NodeReadMark((Dsd_Node_t *)((ulong)pDVar10 & 0xfffffffffffffffe));
          if ((uVar5 & 1) != 0) {
            __assert_fail("!Abc_ObjIsComplement(pNodeNew)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDsd.c"
                          ,0xc9,
                          "void Abc_NtkDsdConstruct(Dsd_Manager_t *, Abc_Ntk_t *, Abc_Ntk_t *)");
          }
          puVar4[8] = (ulong)((uint)pDVar10 & 1) | (long)(int)uVar5;
          pVVar11 = pNtk->vCos;
        }
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 < pVVar11->nSize);
  }
  Abc_NtkFinalize(pNtk,pNtk_00);
  Abc_NtkLogicMakeSimpleCos(pNtk_00,0);
  if (fPrint != 0) {
    pInputNames = Abc_NtkCollectCioNames(pNtk,0);
    pOutputNames = Abc_NtkCollectCioNames(pNtk,1);
    if (fVerbose == 0) {
      Dsd_TreePrint2(_stdout,pDsdMan,pInputNames,pOutputNames,-1);
    }
    else {
      Dsd_TreePrint(_stdout,pDsdMan,pInputNames,pOutputNames,fShort,-1);
    }
    if (pInputNames != (char **)0x0) {
      free(pInputNames);
    }
    if (pOutputNames != (char **)0x0) {
      free(pOutputNames);
    }
  }
  Dsd_ManagerStop(pDsdMan);
  return pNtk_00;
}

Assistant:

Abc_Ntk_t * Abc_NtkDsdInternal( Abc_Ntk_t * pNtk, int fVerbose, int fPrint, int fShort )
{
    char ** ppNamesCi, ** ppNamesCo;
    Vec_Ptr_t * vFuncsGlob;
    Dsd_Manager_t * pManDsd;
    Abc_Ntk_t * pNtkNew;
    DdManager * dd;
    Abc_Obj_t * pObj;
    int i;

    // complement the global functions
    vFuncsGlob = Vec_PtrAlloc( Abc_NtkCoNum(pNtk) );
    Abc_NtkForEachCo( pNtk, pObj, i )
        Vec_PtrPush( vFuncsGlob, Cudd_NotCond(Abc_ObjGlobalBdd(pObj), Abc_ObjFaninC0(pObj)) );

    // perform the decomposition
    dd = (DdManager *)Abc_NtkGlobalBddMan(pNtk);
    pManDsd = Dsd_ManagerStart( dd, Abc_NtkCiNum(pNtk), fVerbose );
    if ( pManDsd == NULL )
    {
        Vec_PtrFree( vFuncsGlob );
        Cudd_Quit( dd );
        return NULL;
    }
    Dsd_Decompose( pManDsd, (DdNode **)vFuncsGlob->pArray, Abc_NtkCoNum(pNtk) );
    Vec_PtrFree( vFuncsGlob );
    Abc_NtkFreeGlobalBdds( pNtk, 0 );

    // start the new network
    pNtkNew = Abc_NtkStartFrom( pNtk, ABC_NTK_LOGIC, ABC_FUNC_BDD );
    // make sure the new manager has enough inputs
    Cudd_bddIthVar( (DdManager *)pNtkNew->pManFunc, dd->size-1 );
    // put the results into the new network (save new CO drivers in old CO drivers)
    Abc_NtkDsdConstruct( pManDsd, pNtk, pNtkNew );
    // finalize the new network
    Abc_NtkFinalize( pNtk, pNtkNew );
    // fix the problem with complemented and duplicated CO edges
    Abc_NtkLogicMakeSimpleCos( pNtkNew, 0 );
    if ( fPrint )
    {
        ppNamesCi = Abc_NtkCollectCioNames( pNtk, 0 );
        ppNamesCo = Abc_NtkCollectCioNames( pNtk, 1 );
        if ( fVerbose )
            Dsd_TreePrint( stdout, pManDsd, ppNamesCi, ppNamesCo, fShort, -1 );
        else
            Dsd_TreePrint2( stdout, pManDsd, ppNamesCi, ppNamesCo, -1 );
        ABC_FREE( ppNamesCi );
        ABC_FREE( ppNamesCo );
    }

    // stop the DSD manager
    Dsd_ManagerStop( pManDsd );
    return pNtkNew;
}